

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O3

void __kmp_GOMP_doacross_wait<long>(long first,__va_list_tag *args)

{
  uint uVar1;
  kmp_info_t *th;
  long lVar2;
  int gtid;
  kmp_int64 *vec;
  long lVar3;
  kmp_int64 *pkVar4;
  
  gtid = __kmp_get_global_thread_id_reg();
  th = __kmp_threads[gtid];
  lVar2 = *(((th->th).th_dispatch)->field_8).th_doacross_info;
  vec = (kmp_int64 *)___kmp_thread_malloc(th,lVar2 * 8);
  *vec = first;
  if (1 < lVar2) {
    lVar3 = 1;
    do {
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        pkVar4 = (kmp_int64 *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        pkVar4 = (kmp_int64 *)args->overflow_arg_area;
        args->overflow_arg_area = pkVar4 + 1;
      }
      vec[lVar3] = *pkVar4;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  __kmpc_doacross_wait(&__kmp_GOMP_doacross_wait<long>::loc,gtid,vec);
  ___kmp_thread_free(th,vec);
  return;
}

Assistant:

void __kmp_GOMP_doacross_wait(T first, va_list args) {
  int gtid = __kmp_entry_gtid();
  kmp_info_t *th = __kmp_threads[gtid];
  MKLOC(loc, "GOMP_doacross_wait");
  kmp_int64 num_dims = th->th.th_dispatch->th_doacross_info[0];
  kmp_int64 *vec =
      (kmp_int64 *)__kmp_thread_malloc(th, sizeof(kmp_int64) * num_dims);
  vec[0] = (kmp_int64)first;
  for (kmp_int64 i = 1; i < num_dims; ++i) {
    T item = va_arg(args, T);
    vec[i] = (kmp_int64)item;
  }
  __kmpc_doacross_wait(&loc, gtid, vec);
  __kmp_thread_free(th, vec);
  return;
}